

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

int auxgetinfo(lua_State *L,char *what,lua_Debug *ar,Closure *f,CallInfo *ci)

{
  lu_byte lVar1;
  char *pcVar2;
  int local_44;
  int local_34;
  int status;
  CallInfo *ci_local;
  Closure *f_local;
  lua_Debug *ar_local;
  char *what_local;
  lua_State *L_local;
  
  local_34 = 1;
  for (ar_local = (lua_Debug *)what; (char)ar_local->event != '\0';
      ar_local = (lua_Debug *)((long)&ar_local->event + 1)) {
    switch((char)ar_local->event) {
    case 'L':
    case 'f':
      break;
    default:
      local_34 = 0;
      break;
    case 'S':
      funcinfo(ar,f);
      break;
    case 'l':
      if ((ci == (CallInfo *)0x0) || ((ci->callstatus & 0x8000) != 0)) {
        local_44 = -1;
      }
      else {
        local_44 = getcurrentline(ci);
      }
      ar->currentline = local_44;
      break;
    case 'n':
      pcVar2 = getfuncname(L,ci,&ar->name);
      ar->namewhat = pcVar2;
      if (ar->namewhat == (char *)0x0) {
        ar->namewhat = "";
        ar->name = (char *)0x0;
      }
      break;
    case 'r':
      if ((ci == (CallInfo *)0x0) || ((ci->callstatus & 0x100000) == 0)) {
        ar->ntransfer = 0;
        ar->ftransfer = 0;
      }
      else {
        ar->ftransfer = (L->transferinfo).ftransfer;
        ar->ntransfer = (L->transferinfo).ntransfer;
      }
      break;
    case 't':
      if (ci == (CallInfo *)0x0) {
        ar->istailcall = '\0';
        ar->extraargs = '\0';
      }
      else {
        ar->istailcall = (ci->callstatus & 0x400000) != 0;
        ar->extraargs = (byte)(ci->callstatus >> 8) & 0xf;
      }
      break;
    case 'u':
      if (f == (Closure *)0x0) {
        lVar1 = '\0';
      }
      else {
        lVar1 = (f->c).nupvalues;
      }
      ar->nups = lVar1;
      if ((f == (Closure *)0x0) || ((f->c).tt != '\x06')) {
        ar->isvararg = '\x01';
        ar->nparams = '\0';
      }
      else {
        ar->isvararg = (((f->l).p)->flag & 1) != 0;
        ar->nparams = ((f->l).p)->numparams;
      }
    }
  }
  return local_34;
}

Assistant:

static int auxgetinfo (lua_State *L, const char *what, lua_Debug *ar,
                       Closure *f, CallInfo *ci) {
  int status = 1;
  for (; *what; what++) {
    switch (*what) {
      case 'S': {
        funcinfo(ar, f);
        break;
      }
      case 'l': {
        ar->currentline = (ci && isLua(ci)) ? getcurrentline(ci) : -1;
        break;
      }
      case 'u': {
        ar->nups = (f == NULL) ? 0 : f->c.nupvalues;
        if (!LuaClosure(f)) {
          ar->isvararg = 1;
          ar->nparams = 0;
        }
        else {
          ar->isvararg = (f->l.p->flag & PF_ISVARARG) ? 1 : 0;
          ar->nparams = f->l.p->numparams;
        }
        break;
      }
      case 't': {
        if (ci != NULL) {
          ar->istailcall = !!(ci->callstatus & CIST_TAIL);
          ar->extraargs =
                   cast_uchar((ci->callstatus & MAX_CCMT) >> CIST_CCMT);
        }
        else {
          ar->istailcall = 0;
          ar->extraargs = 0;
        }
        break;
      }
      case 'n': {
        ar->namewhat = getfuncname(L, ci, &ar->name);
        if (ar->namewhat == NULL) {
          ar->namewhat = "";  /* not found */
          ar->name = NULL;
        }
        break;
      }
      case 'r': {
        if (ci == NULL || !(ci->callstatus & CIST_HOOKED))
          ar->ftransfer = ar->ntransfer = 0;
        else {
          ar->ftransfer = L->transferinfo.ftransfer;
          ar->ntransfer = L->transferinfo.ntransfer;
        }
        break;
      }
      case 'L':
      case 'f':  /* handled by lua_getinfo */
        break;
      default: status = 0;  /* invalid option */
    }
  }
  return status;
}